

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t driver::zeEventQueryStatus(ze_event_handle_t hEvent)

{
  ze_pfnEventQueryStatus_t pfnQueryStatus;
  ze_result_t result;
  ze_event_handle_t hEvent_local;
  
  pfnQueryStatus._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c5f0 != (code *)0x0) {
    pfnQueryStatus._4_4_ = (*DAT_0011c5f0)(hEvent);
  }
  return pfnQueryStatus._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventQueryStatus(
        ze_event_handle_t hEvent                        ///< [in] handle of the event
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnQueryStatus = context.zeDdiTable.Event.pfnQueryStatus;
        if( nullptr != pfnQueryStatus )
        {
            result = pfnQueryStatus( hEvent );
        }
        else
        {
            // generic implementation
        }

        return result;
    }